

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcknowledgePdu.cpp
# Opt level: O3

bool __thiscall DIS::AcknowledgePdu::operator==(AcknowledgePdu *this,AcknowledgePdu *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  
  bVar1 = SimulationManagementFamilyPdu::operator==
                    (&this->super_SimulationManagementFamilyPdu,
                     &rhs->super_SimulationManagementFamilyPdu);
  bVar2 = EntityID::operator==(&this->_originatingID,&rhs->_originatingID);
  bVar3 = EntityID::operator==(&this->_receivingID,&rhs->_receivingID);
  return ((bVar3 && (bVar2 && bVar1)) && this->_acknowledgeFlag == rhs->_acknowledgeFlag) &&
         (this->_requestID == rhs->_requestID && this->_responseFlag == rhs->_responseFlag);
}

Assistant:

bool AcknowledgePdu::operator ==(const AcknowledgePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

     if( ! (_originatingID == rhs._originatingID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;
     if( ! (_acknowledgeFlag == rhs._acknowledgeFlag) ) ivarsEqual = false;
     if( ! (_responseFlag == rhs._responseFlag) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;

    return ivarsEqual;
 }